

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O0

bool_t priNextPrime(word *p,word *a,size_t n,size_t trials,size_t base_count,size_t iter,void *stack
                   )

{
  long lVar1;
  bool_t bVar2;
  size_t n_00;
  word wVar3;
  size_t sVar4;
  long in_RCX;
  long lVar5;
  size_t in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *in_R8;
  word *in_R9;
  bool bVar6;
  void *unaff_retaddr;
  long in_stack_00000008;
  word *mods;
  word *in_stack_00000018;
  bool_t base_success;
  size_t i;
  size_t l;
  size_t in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 uVar7;
  undefined1 in_stack_ffffffffffffffa7;
  size_t in_stack_ffffffffffffffb8;
  word *pwVar8;
  long local_28;
  
  lVar5 = (long)in_R8 * 8;
  n_00 = wwBitSize((word *)CONCAT17(in_stack_ffffffffffffffa7,
                                    CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                   in_stack_ffffffffffffff98);
  if (n_00 < 2) {
    return 0;
  }
  wwCopy(in_RDI,in_RSI,in_RDX);
  *in_RDI = *in_RDI | 1;
  if (in_RDX == 1) {
    while( true ) {
      bVar6 = false;
      if (in_R8 != (word *)0x0) {
        wVar3 = priBasePrime((long)in_R8 - 1);
        bVar6 = *in_RDI <= wVar3;
      }
      if (!bVar6) break;
      in_R8 = (word *)((long)in_R8 + -1);
    }
    in_stack_ffffffffffffffa7 = 0;
  }
  priBaseMod(in_R8,in_R9,n_00,in_stack_ffffffffffffffb8);
  pwVar8 = (word *)0x0;
  bVar6 = true;
  do {
    local_28 = in_RCX;
    if (in_R8 <= pwVar8) {
LAB_001661b9:
      while( true ) {
        lVar1 = local_28;
        if (local_28 != -1) {
          local_28 = local_28 + -1;
        }
        uVar7 = lVar1 != 0;
        if (lVar1 == 0) {
          return 0;
        }
        if ((bVar6) &&
           (bVar2 = priRMTest(in_stack_00000018,(size_t)mods,in_stack_00000008 + lVar5,unaff_retaddr
                             ), bVar2 != 0)) {
          return 1;
        }
        wVar3 = zzAddW2(in_RDI,in_RDX,2);
        if ((wVar3 != 0) ||
           (sVar4 = wwBitSize((word *)CONCAT17(in_stack_ffffffffffffffa7,
                                               CONCAT16(uVar7,in_stack_ffffffffffffffa0)),
                              in_stack_ffffffffffffff98), n_00 < sVar4)) break;
        bVar6 = true;
        for (pwVar8 = (word *)0x0; pwVar8 < in_R8; pwVar8 = (word *)((long)pwVar8 + 1)) {
          if (*(ulong *)(in_stack_00000008 + (long)pwVar8 * 8) < _base[(long)pwVar8] - 2) {
            *(long *)(in_stack_00000008 + (long)pwVar8 * 8) =
                 *(long *)(in_stack_00000008 + (long)pwVar8 * 8) + 2;
          }
          else if (*(long *)(in_stack_00000008 + (long)pwVar8 * 8) == _base[(long)pwVar8] - 1) {
            *(undefined8 *)(in_stack_00000008 + (long)pwVar8 * 8) = 1;
          }
          else {
            *(undefined8 *)(in_stack_00000008 + (long)pwVar8 * 8) = 0;
            bVar6 = false;
          }
        }
      }
      return 0;
    }
    if (*(long *)(in_stack_00000008 + (long)pwVar8 * 8) == 0) {
      bVar6 = false;
      goto LAB_001661b9;
    }
    pwVar8 = (word *)((long)pwVar8 + 1);
  } while( true );
}

Assistant:

bool_t priNextPrime(word p[], const word a[], size_t n, size_t trials,
	size_t base_count, size_t iter, void* stack)
{
	size_t l;
	size_t i;
	bool_t base_success;
	// переменные в stack
	word* mods;
	// pre
	ASSERT(wwIsSameOrDisjoint(a, p, n));
	ASSERT(base_count <= priBaseSize());
	// раскладка stack
	mods = (word*)stack;
	stack = mods + base_count;
	// l <- битовая длина a
	l = wwBitSize(a, n);
	// 0-битовых и 1-битовых простых не существует
	if (l <= 1)
		return FALSE;
	// p <- минимальное нечетное >= a
	wwCopy(p, a, n);
	p[0] |= 1;
	// малое p?
	if (n == 1)
		// при необходимости скорректировать факторную базу
		while (base_count > 0 && priBasePrime(base_count - 1) >= p[0])
			--base_count;
	// рассчитать остатки от деления на малые простые
	priBaseMod(mods, p, n, base_count);
	for (i = 0, base_success = TRUE; i < base_count; ++i)
		if (mods[i] == 0)
		{
			base_success = FALSE;
			break;
		}
	// попытки
	while (trials == SIZE_MAX || trials--)
	{
		// проверка простоты
		if (base_success && priRMTest(p, n, iter, stack))
			return TRUE;
		// к следующему кандидату
		if (zzAddW2(p, n, 2) || wwBitSize(p, n) > l)
			return FALSE;
		for (i = 0, base_success = TRUE; i < base_count; ++i)
		{
			if (mods[i] < _base[i] - 2)
				mods[i] += 2;
			else if (mods[i] == _base[i] - 1)
				mods[i] = 1;
			else
				mods[i] = 0, base_success = FALSE;
		}
	}
	return FALSE;
}